

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O2

void __thiscall ltc::set_store_data(ltc *this,ltc_store_data *data)

{
  float fVar1;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_58;
  undefined4 local_4c;
  float local_48;
  undefined4 local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  mat3 local_34;
  
  fVar1 = data->fresnel_term;
  this->_amplitude = data->distribution_norm;
  this->_fresnel = fVar1;
  local_58.field_0.x = (data->matrix_parameters)._M_elems[0];
  local_58.field_0.z = (data->matrix_parameters)._M_elems[1];
  local_48 = (data->matrix_parameters)._M_elems[2];
  local_40 = (data->matrix_parameters)._M_elems[3];
  local_38 = (data->matrix_parameters)._M_elems[4];
  local_58.field_0.y = 0.0;
  local_4c = 0;
  local_44 = 0;
  local_3c = 0;
  glm::detail::compute_inverse<glm::mat,_3,_3,_float,_(glm::precision)0,_false>::call
            ((mat<3,_3,_float,_(glm::precision)0> *)&local_58.field_0);
  set_ltc_matrix(this,&local_34);
  *(undefined8 *)&(this->_base_frame).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_base_frame).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_base_frame).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_base_frame).value[2].field_0 = 0;
  (this->_base_frame).value[2].field_0.field_0.z = 1.0;
  return;
}

Assistant:

void ltc::set_store_data(const ltc_store_data &data)
{
  _amplitude = data.distribution_norm;
  _fresnel = data.fresnel_term;

  // TODO: Inverse may cause loss of data. It is done at least once during fitting process.
  const auto &mtx = data.matrix_parameters;
  set_ltc_matrix(glm::inverse(glm::mat3{
    {mtx[0], 0.0f,   mtx[1]},
    {0.0f,   mtx[2], 0.0f},
    {mtx[3], 0.0f,   mtx[4]}
  }));

  _base_frame = glm::mat4{};
}